

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_function_queue.h
# Opt level: O1

optional<double> __thiscall
density::
lf_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
::try_consume_impl(lf_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                   *this,LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
                         *param_2)

{
  double dVar1;
  bool bVar2;
  FunctionRuntimeType<(density::function_type_erasure)0,_double_()> *pFVar3;
  void *pvVar4;
  undefined8 extraout_RDX;
  optional<double> oVar5;
  consume_operation cons;
  Consume local_38;
  
  local_38.m_queue =
       (LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
        *)0x0;
  local_38.m_control = (ControlBlock *)0x0;
  local_38.m_next_ptr = 0;
  detail::
  LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
  ::Consume::start_consume_impl(&local_38,param_2);
  bVar2 = detail::
          LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
          ::Consume::empty(&local_38);
  if (bVar2) {
    (this->m_queue).
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
    .
    super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    .m_tail.super___atomic_base<unsigned_long>._M_i = 0;
    (this->m_queue).
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
    .
    super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    .m_initial_page.super___atomic_base<unsigned_long>._M_i = 0;
  }
  else {
    pFVar3 = lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
             ::consume_operation::complete_type((consume_operation *)&local_38);
    pvVar4 = lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
             ::consume_operation::unaligned_element_ptr((consume_operation *)&local_38);
    dVar1 = (*pFVar3->m_align_invoke_destroy)(pvVar4);
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    ::consume_operation::commit_nodestroy((consume_operation *)&local_38);
    *(undefined1 *)
     &(this->m_queue).
      super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
      .
      super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
      .m_initial_page.super___atomic_base<unsigned_long>._M_i = 1;
    (this->m_queue).
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
    .
    super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
    .m_tail.super___atomic_base<unsigned_long>._M_i = (__int_type)dVar1;
  }
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
  ::consume_operation::~consume_operation((consume_operation *)&local_38);
  oVar5._8_8_ = extraout_RDX;
  oVar5.m_storage = (type)this;
  return oVar5;
}

Assistant:

optional<RET_VAL> try_consume_impl(std::false_type, PARAMS... i_params)
        {
            if (auto cons = m_queue.try_start_consume())
            {
                auto && result = cons.complete_type().align_invoke_destroy(
                  cons.unaligned_element_ptr(), std::forward<PARAMS>(i_params)...);
                cons.commit_nodestroy();
                return optional<RET_VAL>(std::move(result));
            }
            else
            {
                return optional<RET_VAL>();
            }
        }